

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O2

iuIParamGenerator<int> * __thiscall
iutest::detail::iuValueArray::operator_cast_to_iuIParamGenerator_(iuValueArray *this)

{
  any in_RAX [1];
  iuValuesInParamsGenerator<iutest::any> *this_00;
  make_array<iutest::any> ar;
  
  ar.val[0].content = (any  [1])(any  [1])in_RAX[0].content;
  iuValueArray<int>::make_array<iutest::any>::make_array(&ar,(_MyTuple *)this);
  this_00 = (iuValuesInParamsGenerator<iutest::any> *)operator_new(0x28);
  iuValuesInParamsGenerator<iutest::any>::iuValuesInParamsGenerator<iutest::any,1ul>(this_00,ar.val)
  ;
  if ((any)ar.val[0].content != (any)0x0) {
    (**(code **)(*(long *)ar.val[0].content + 8))();
  }
  return &this_00->super_iuIParamGenerator<int>;
}

Assistant:

operator iuIParamGenerator<T>* () const
    {
        make_array<T> ar(v);
#if !defined(IUTEST_NO_FUNCTION_TEMPLATE_ORDERING)
        return new iuValuesInParamsGenerator<T>(ar.val);
#else
        return new iuValuesInParamsGenerator<T>(ar.val, ar.val + IUTEST_PP_COUNTOF(ar.val));
#endif
    }